

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hh
# Opt level: O2

void __thiscall Matrix<double>::Matrix(Matrix<double> *this,int rr,int cc,double init)

{
  allocator_type local_3a;
  allocator_type local_39;
  _Vector_base<double,_std::allocator<double>_> local_38;
  double local_20;
  
  this->r = rr;
  this->c = cc;
  local_20 = init;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_38,(long)cc,&local_20,&local_39);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->t,(long)rr,(value_type *)&local_38,&local_3a);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

Matrix(int rr, int cc, T init=T()) :
		r(rr), c(cc), t(vector<vector<T> >(r, vector<T>(c, init))) {}